

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O2

Vec_Int_t * Bmc_ChainFindFailedOutputs(Gia_Man_t *p,Vec_Ptr_t *vCexes)

{
  int iVar1;
  Gia_Man_t *p_00;
  Vec_Int_t *vSatIds;
  sat_solver *s;
  Gia_Obj_t *pObj;
  Abc_Cex_t *Entry;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  Vec_Int_t *p_01;
  int Lit;
  ulong local_48;
  Vec_Ptr_t *local_40;
  Vec_Int_t *local_38;
  
  local_40 = vCexes;
  p_00 = Gia_ManDupPosAndPropagateInit(p);
  vSatIds = Vec_IntAlloc(p->vCis->nSize - p->nRegs);
  s = Gia_ManDeriveSatSolver(p_00,vSatIds);
  local_38 = Vec_IntAlloc(100);
  uVar3 = 0;
  p_01 = local_38;
  while (iVar4 = (int)uVar3, iVar4 < p_00->vCos->nSize - p_00->nRegs) {
    pObj = Gia_ManCo(p_00,iVar4);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFaninLit0p(p_00,pObj);
    uVar2 = iVar4 + 1;
    uVar3 = (ulong)uVar2;
    if (iVar1 != 0) {
      local_48 = (ulong)uVar2;
      Lit = Abc_Var2Lit(uVar2,0);
      iVar1 = sat_solver_solve(s,&Lit,(lit *)&local_48,0,0,0,0);
      uVar3 = local_48;
      if (iVar1 == 1) {
        Vec_IntPush(p_01,iVar4);
        uVar3 = local_48;
        if (local_40 != (Vec_Ptr_t *)0x0) {
          Entry = Abc_CexAlloc(p->nRegs,p->vCis->nSize - p->nRegs,1);
          Entry->iFrame = 0;
          Entry->iPo = iVar4;
          for (iVar4 = 0; iVar4 < p->vCis->nSize - p->nRegs; iVar4 = iVar4 + 1) {
            uVar2 = Vec_IntEntry(vSatIds,iVar4);
            if (((int)uVar2 < 0) || (s->size <= (int)uVar2)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                            ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
            }
            if (s->model[uVar2] == 1) {
              iVar1 = p->nRegs + iVar4;
              (&Entry[1].iPo)[iVar1 >> 5] = (&Entry[1].iPo)[iVar1 >> 5] | 1 << ((byte)iVar1 & 0x1f);
            }
          }
          Vec_PtrPush(local_40,Entry);
          uVar3 = local_48;
          p_01 = local_38;
        }
      }
    }
  }
  Gia_ManStop(p_00);
  sat_solver_delete(s);
  Vec_IntFree(vSatIds);
  return p_01;
}

Assistant:

Vec_Int_t * Bmc_ChainFindFailedOutputs( Gia_Man_t * p, Vec_Ptr_t * vCexes )
{
    Vec_Int_t * vOutputs;
    Vec_Int_t * vSatIds;
    Gia_Man_t * pInit;
    Gia_Obj_t * pObj;
    sat_solver * pSat;
    int i, j, Lit, status = 0;
    // derive output logic cones
    pInit = Gia_ManDupPosAndPropagateInit( p );
    // derive SAT solver and test
    vSatIds = Vec_IntAlloc( Gia_ManPiNum(p) );
    pSat = Gia_ManDeriveSatSolver( pInit, vSatIds );
    vOutputs = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( pInit, pObj, i )
    {
        if ( Gia_ObjFaninLit0p(pInit, pObj) == 0 )
            continue;
        Lit = Abc_Var2Lit( i+1, 0 );
        status = sat_solver_solve( pSat, &Lit, &Lit + 1, 0, 0, 0, 0 );
        if ( status == l_True )
        {
            // save the index of solved output
            Vec_IntPush( vOutputs, i );
            // create CEX for this output
            if ( vCexes )
            {
                Abc_Cex_t * pCex = Abc_CexAlloc( Gia_ManRegNum(p), Gia_ManPiNum(p), 1 );
                pCex->iFrame = 0;
                pCex->iPo = i;
                for ( j = 0; j < Gia_ManPiNum(p); j++ )
                    if ( sat_solver_var_value( pSat, Vec_IntEntry(vSatIds, j) ) )
                        Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p) + j );
                Vec_PtrPush( vCexes, pCex );
            }
        }
    }
    Gia_ManStop( pInit );
    sat_solver_delete( pSat );
    Vec_IntFree( vSatIds );
    return vOutputs;
}